

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O1

void isort(uchar **a,int n,int d)

{
  uchar **ppuVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool bVar4;
  long lVar5;
  uchar **ppuVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  
  if (1 < n) {
    lVar5 = (long)d;
    ppuVar6 = a;
    do {
      ppuVar6 = ppuVar6 + 1;
      for (ppuVar1 = ppuVar6; a < ppuVar1; ppuVar1 = ppuVar1 + -1) {
        puVar2 = ppuVar1[-1];
        puVar3 = *ppuVar1;
        bVar8 = puVar2[lVar5];
        bVar7 = puVar3[lVar5];
        lVar9 = lVar5;
        if (bVar8 != 0 && bVar8 == bVar7) {
          do {
            lVar9 = lVar9 + 1;
            bVar8 = puVar2[lVar9];
            bVar7 = puVar3[lVar9];
            if (bVar8 == 0) break;
          } while (bVar8 == bVar7);
        }
        if (bVar8 <= bVar7) break;
        *ppuVar1 = puVar2;
        ppuVar1[-1] = puVar3;
      }
      bVar4 = 2 < n;
      n = n + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

static
void isort(unsigned char **a, int n, int d)
{
	unsigned char **pi, **pj, *s, *t;
	for (pi = a + 1; --n > 0; pi++)
		for (pj = pi; pj > a; pj--) {
			for (s=*(pj-1)+d, t=*pj+d;
					*s==*t && *s!=0; s++, t++) ;
			if (*s <= *t) break;
			t = *(pj); *(pj) = *(pj-1);
			*(pj-1) = t;
		}
}